

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O2

pid_t id_peer(int fd,char **name)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  socklen_t len;
  ucred ucred;
  char path [30];
  
  exe[0] = '\0';
  *name = exe;
  len = 0xc;
  iVar2 = getsockopt(fd,1,0x11,&ucred,&len);
  if (iVar2 < 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    syslog(3,"getsockopt: %s\n",pcVar7);
    ucred.pid = 0;
  }
  else {
    snprintf(path,0x1e,"/proc/%u/exe",(ulong)(uint)ucred.pid);
    sVar4 = readlink(path,exe,99);
    uVar3 = (uint)sVar4;
    if (-1 < (int)uVar3) {
      if (uVar3 == 0) {
        __assert_fail("sc > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/pmtr.c"
                      ,0xb6,"pid_t id_peer(int, char **)");
      }
      exe[uVar3 & 0x7fffffff] = '\0';
      uVar5 = (ulong)(uVar3 & 0x7fffffff);
      do {
        if ((long)uVar5 < 1) {
          return ucred.pid;
        }
        uVar1 = uVar5 - 1;
        pcVar7 = &DAT_00110ccf + uVar5;
        uVar5 = uVar1;
      } while (*pcVar7 != '/');
      *name = exe + ((int)uVar1 + 1);
    }
  }
  return ucred.pid;
}

Assistant:

pid_t id_peer(int fd, char **name) {
  struct ucred ucred;
  int rc = -1, sc, i;
  socklen_t len;

  *exe = '\0';
  *name = exe;

  len = sizeof(struct ucred);
  sc = getsockopt(fd, SOL_SOCKET, SO_PEERCRED, &ucred, &len);
  if (sc < 0) {
    syslog(LOG_ERR, "getsockopt: %s\n", strerror(errno));
    return (pid_t)0;
  }

  /* try to lookup the executable name from /proc/<pid>/exe */
  char path[30];
  snprintf(path, sizeof(path), "/proc/%u/exe", (unsigned)ucred.pid);
  sc = readlink(path, exe, sizeof(exe)-1);
  if (sc < 0) {
    /* allow failure here, /proc filesystem not present? */
    //syslog(LOG_ERR, "readlink: %s\n", strerror(errno));
  } else {
    /* readlink does not null-terminate its output. do so */
    assert(sc > 0);
    exe[sc] = '\0';
    /* lastly, take basename() of the target */
    for(i = sc-1; i >= 0; i--) {
      if (exe[i] == '/') {
        *name = &exe[i+1];
        break;
      }
    }

  }
  return ucred.pid;
}